

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_violate(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch_00;
  char *in_RSI;
  long in_RDI;
  CHAR_DATA *rch;
  ROOM_INDEX_DATA *location;
  CHAR_DATA *in_stack_00000030;
  char *in_stack_00005c30;
  CHAR_DATA *in_stack_00005c38;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  CHAR_DATA *in_stack_ffffffffffffffe0;
  void *pvVar3;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  if (*in_RSI == '\0') {
    send_to_char(in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    ch_00 = (CHAR_DATA *)find_location(in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char(in_RSI,(CHAR_DATA *)0x0);
    }
    else {
      bVar1 = room_is_private((ROOM_INDEX_DATA *)ch_00);
      if (bVar1) {
        if (*(long *)(in_RDI + 0x20) != 0) {
          stop_fighting(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
        }
        for (pvVar3 = *(void **)(*(long *)(in_RDI + 0xa8) + 0x18); pvVar3 != (void *)0x0;
            pvVar3 = *(void **)((long)pvVar3 + 8)) {
          iVar2 = get_trust((CHAR_DATA *)
                            CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
          if ((*(short *)(in_RDI + 0x1e0) <= iVar2) &&
             (((iVar2 = get_trust((CHAR_DATA *)
                                  CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8)),
               iVar2 != 0x33 || (*(short *)(in_RDI + 0x1e0) != 0x33)) ||
              (bVar1 = is_heroimm((CHAR_DATA *)
                                  CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8)),
              bVar1)))) {
            if ((*(long *)(in_RDI + 0xc0) == 0) ||
               (**(char **)(*(long *)(in_RDI + 0xc0) + 0x28) == '\0')) {
              act(in_RSI,ch_00,pvVar3,
                  (void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0);
            }
            else {
              act(in_RSI,ch_00,pvVar3,
                  (void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0);
            }
          }
        }
        char_from_room(in_stack_00000030);
        char_to_room((CHAR_DATA *)location,(ROOM_INDEX_DATA *)rch);
        for (pvVar3 = *(void **)(*(long *)(in_RDI + 0xa8) + 0x18); pvVar3 != (void *)0x0;
            pvVar3 = *(void **)((long)pvVar3 + 8)) {
          iVar2 = get_trust((CHAR_DATA *)
                            CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
          if (*(short *)(in_RDI + 0x1e0) <= iVar2) {
            if ((*(long *)(in_RDI + 0xc0) == 0) ||
               (**(char **)(*(long *)(in_RDI + 0xc0) + 0x20) == '\0')) {
              act(in_RSI,ch_00,pvVar3,
                  (void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0);
            }
            else {
              act(in_RSI,ch_00,pvVar3,
                  (void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0);
            }
          }
        }
        do_look(in_stack_00005c38,in_stack_00005c30);
      }
      else {
        send_to_char(in_RSI,ch_00);
      }
    }
  }
  return;
}

Assistant:

void do_violate(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *location;
	CHAR_DATA *rch;

	if (argument[0] == '\0')
	{
		send_to_char("Goto where?\n\r", ch);
		return;
	}

	location = find_location(ch, argument);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	if (!room_is_private(location))
	{
		send_to_char("That room isn't private, use goto.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
		stop_fighting(ch, true);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (get_trust(rch) == LEVEL_HERO && ch->invis_level == LEVEL_HERO && !is_heroimm(rch))
				continue;

			if (ch->pcdata != nullptr && ch->pcdata->bamfout[0] != '\0')
				act("$t", ch, ch->pcdata->bamfout, rch, TO_VICT);
			else
				act("$n leaves in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	char_from_room(ch);
	char_to_room(ch, location);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (ch->pcdata != nullptr && ch->pcdata->bamfin[0] != '\0')
				act("$t", ch, ch->pcdata->bamfin, rch, TO_VICT);
			else
				act("$n appears in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	do_look(ch, "auto");
}